

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O0

int pztopology::TPZLine::GetTransformId(int side,TPZVec<long> *id)

{
  long lVar1;
  long *plVar2;
  ostream *this;
  TPZVec<long> *in_RSI;
  uint in_EDI;
  uint local_4;
  
  if (in_EDI < 2) {
    local_4 = 0;
  }
  else if (in_EDI == 2) {
    plVar2 = TPZVec<long>::operator[](in_RSI,0);
    lVar1 = *plVar2;
    plVar2 = TPZVec<long>::operator[](in_RSI,1);
    local_4 = (uint)(*plVar2 <= lVar1);
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"Wrong input parameter");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int TPZLine::GetTransformId(const int side, const TPZVec<int64_t> &id)
	{
		switch (side) {
			case 0:
			case 1:
				return 0;
				break;
			case 2:
				return id[0] < id[1] ? 0 : 1;
			default:
				break;
		}
		LOGPZ_ERROR(logger,"Wrong input parameter")
		return -1;
	}